

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pyi_generator.cc
# Opt level: O1

string * __thiscall
google::protobuf::compiler::python::PyiGenerator::ExtraInitTypes_abi_cxx11_
          (string *__return_storage_ptr__,PyiGenerator *this,Descriptor *msg_des)

{
  ushort uVar1;
  int iVar2;
  char *pcVar3;
  size_type __rlen;
  ulong __n;
  char *pcVar4;
  
  pcVar4 = (msg_des->all_names_).payload_;
  uVar1 = *(ushort *)(pcVar4 + 2);
  __n = (ulong)uVar1;
  pcVar4 = pcVar4 + ~__n;
  if (uVar1 == 0x18) {
    iVar2 = bcmp(pcVar4,"google.protobuf.Duration",__n);
    if (iVar2 == 0) {
      (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
      pcVar3 = "datetime.timedelta, ";
      pcVar4 = "";
      goto LAB_00e5b911;
    }
  }
  else if ((uVar1 == 0x19) && (iVar2 = bcmp(pcVar4,"google.protobuf.Timestamp",__n), iVar2 == 0)) {
    (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
    pcVar3 = "datetime.datetime, ";
    pcVar4 = "";
    goto LAB_00e5b911;
  }
  (__return_storage_ptr__->_M_dataplus)._M_p = (pointer)&__return_storage_ptr__->field_2;
  pcVar4 = anon_var_dwarf_a12c75 + 5;
  pcVar3 = anon_var_dwarf_a12c75 + 5;
LAB_00e5b911:
  std::__cxx11::string::_M_construct<char_const*>((string *)__return_storage_ptr__,pcVar3,pcVar4);
  return __return_storage_ptr__;
}

Assistant:

std::string PyiGenerator::ExtraInitTypes(const Descriptor& msg_des) const {
  if (msg_des.full_name() == "google.protobuf.Timestamp") {
    return "datetime.datetime, ";
  } else if (msg_des.full_name() == "google.protobuf.Duration") {
    return "datetime.timedelta, ";
  } else {
    return "";
  }
}